

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  anon_union_8_5_2195ba05_for_data_ aVar1;
  uint32_t uVar2;
  int iVar3;
  pointer pUVar4;
  Arena *pAVar5;
  pointer pUVar6;
  int new_size;
  int i;
  int index;
  
  index = 0;
  new_size = 0;
  while( true ) {
    iVar3 = RepeatedField<google::protobuf::UnknownField>::size(&this->fields_);
    if (iVar3 <= index) break;
    pUVar4 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,index);
    if (pUVar4->number_ == number) {
      pAVar5 = RepeatedField<google::protobuf::UnknownField>::GetArena(&this->fields_);
      if (pAVar5 == (Arena *)0x0) {
        UnknownField::Delete(pUVar4);
      }
    }
    else {
      if (index != new_size) {
        pUVar4 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,index);
        pUVar6 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,new_size);
        uVar2 = pUVar4->type_;
        aVar1 = pUVar4->data_;
        pUVar6->number_ = pUVar4->number_;
        pUVar6->type_ = uVar2;
        pUVar6->data_ = aVar1;
      }
      new_size = new_size + 1;
    }
    index = index + 1;
  }
  RepeatedField<google::protobuf::UnknownField>::Truncate(&this->fields_,new_size);
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_.size(); ++i) {
    UnknownField* field = &(fields_)[i];
    if (field->number() == number) {
      if (arena() == nullptr) {
        field->Delete();
      }
    } else {
      if (i != left) {
        (fields_)[left] = (fields_)[i];
      }
      ++left;
    }
  }
  fields_.Truncate(left);
}